

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O0

void __thiscall
absl::lts_20250127::container_internal::
btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>,_const_std::pair<int,_int>_&,_const_std::pair<int,_int>_*>
::decrement(btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>,_const_std::pair<int,_int>_&,_const_std::pair<int,_int>_*>
            *this)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>,_const_std::pair<int,_int>_&,_const_std::pair<int,_int>_*>
  *this_local;
  
  btree_iterator_generation_info_disabled::assert_valid_generation(this->node_);
  bVar1 = btree_node<absl::lts_20250127::container_internal::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>
          ::is_leaf(this->node_);
  if (bVar1) {
    iVar3 = this->position_ + -1;
    this->position_ = iVar3;
    bVar2 = btree_node<absl::lts_20250127::container_internal::set_params<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>,_256,_false>_>
            ::start(this->node_);
    if ((int)(uint)bVar2 <= iVar3) {
      return;
    }
  }
  decrement_slow(this);
  return;
}

Assistant:

void decrement() {
    assert_valid_generation(node_);
    if (node_->is_leaf() && --position_ >= node_->start()) {
      return;
    }
    decrement_slow();
  }